

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fImplementationLimitTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ImplementationLimitTests::init
          (ImplementationLimitTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  LimitQueryCase<int> *pLVar2;
  LimitQueryCase<deqp::gles2::Functional::LimitQuery::FloatRange> *pLVar3;
  LimitQueryCase<deqp::gles2::Functional::LimitQuery::Boolean> *this_00;
  int local_68 [8];
  Boolean local_45;
  int local_44 [2];
  FloatRange local_3c;
  FloatRange local_34;
  int local_2c [6];
  int local_14;
  ImplementationLimitTests *local_10;
  ImplementationLimitTests *this_local;
  
  local_10 = this;
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_14 = 4;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"subpixel_bits","GL_SUBPIXEL_BITS",0xd50,
             &local_14);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_2c[1] = 0x40;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_texture_size","GL_MAX_TEXTURE_SIZE",
             0xd33,local_2c + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_2c[0] = 0x10;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_cube_map_texture_size",
             "GL_MAX_CUBE_MAP_TEXTURE_SIZE",0x851c,local_2c);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar3 = (LimitQueryCase<deqp::gles2::Functional::LimitQuery::FloatRange> *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  LimitQuery::FloatRange::FloatRange(&local_34,1.0,1.0);
  LimitQueryCase<deqp::gles2::Functional::LimitQuery::FloatRange>::LimitQueryCase
            (pLVar3,pCVar1,"aliased_point_size_range","GL_ALIASED_POINT_SIZE_RANGE",0x846d,&local_34
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<deqp::gles2::Functional::LimitQuery::FloatRange> *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  LimitQuery::FloatRange::FloatRange(&local_3c,1.0,1.0);
  LimitQueryCase<deqp::gles2::Functional::LimitQuery::FloatRange>::LimitQueryCase
            (pLVar3,pCVar1,"aliased_line_width_range","GL_ALIASED_LINE_WIDTH_RANGE",0x846e,&local_3c
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_44[1] = 0;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"num_compressed_texture_formats",
             "GL_NUM_COMPRESSED_TEXTURE_FORMATS",0x86a2,local_44 + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_44[0] = 0;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"num_shader_binary_formats",
             "GL_NUM_SHADER_BINARY_FORMATS",0x8df9,local_44);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  this_00 = (LimitQueryCase<deqp::gles2::Functional::LimitQuery::Boolean> *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  LimitQuery::Boolean::Boolean(&local_45,'\0');
  LimitQueryCase<deqp::gles2::Functional::LimitQuery::Boolean>::LimitQueryCase
            (this_00,pCVar1,"shader_compiler","GL_SHADER_COMPILER",0x8dfa,&local_45);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_68[7] = 8;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_vertex_attribs",
             "GL_MAX_VERTEX_ATTRIBS",0x8869,local_68 + 7);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_68[6] = 0x80;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_vertex_uniform_vectors",
             "GL_MAX_VERTEX_UNIFORM_VECTORS",0x8dfb,local_68 + 6);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_68[5] = 8;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_varying_vectors",
             "GL_MAX_VARYING_VECTORS",0x8dfc,local_68 + 5);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_68[4] = 8;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_combined_texture_image_units",
             "GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS",0x8b4d,local_68 + 4);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_68[3] = 0;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_vertex_texture_image_units",
             "GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS",0x8b4c,local_68 + 3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_68[2] = 8;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_texture_image_units",
             "GL_MAX_TEXTURE_IMAGE_UNITS",0x8872,local_68 + 2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_68[1] = 0x10;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_fragment_uniform_vectors",
             "GL_MAX_FRAGMENT_UNIFORM_VECTORS",0x8dfd,local_68 + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_68[0] = 1;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_renderbuffer_size",
             "GL_MAX_RENDERBUFFER_SIZE",0x84e8,local_68);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  return extraout_EAX;
}

Assistant:

void ImplementationLimitTests::init (void)
{
#define LIMIT_CASE(NAME, PARAM, TYPE, MIN_VAL)	\
	addChild(new LimitQueryCase<TYPE>(m_context, #NAME, #PARAM, PARAM, MIN_VAL))

	LIMIT_CASE(subpixel_bits,						GL_SUBPIXEL_BITS,						GLint,		4);
	LIMIT_CASE(max_texture_size,					GL_MAX_TEXTURE_SIZE,					GLint,		64);
	LIMIT_CASE(max_cube_map_texture_size,			GL_MAX_CUBE_MAP_TEXTURE_SIZE,			GLint,		16);
	// GL_MAX_VIEWPORT_DIMS
	LIMIT_CASE(aliased_point_size_range,			GL_ALIASED_POINT_SIZE_RANGE,			FloatRange,	FloatRange(1,1));
	LIMIT_CASE(aliased_line_width_range,			GL_ALIASED_LINE_WIDTH_RANGE,			FloatRange,	FloatRange(1,1));
//	LIMIT_CASE(sample_buffers,						GL_SAMPLE_BUFFERS,						GLint,		0);
//	LIMIT_CASE(samples,								GL_SAMPLES,								GLint,		0);
	LIMIT_CASE(num_compressed_texture_formats,		GL_NUM_COMPRESSED_TEXTURE_FORMATS,		GLint,		0);
	LIMIT_CASE(num_shader_binary_formats,			GL_NUM_SHADER_BINARY_FORMATS,			GLint,		0);
	LIMIT_CASE(shader_compiler,						GL_SHADER_COMPILER,						Boolean,	GL_FALSE);
	// Shader precision format
	LIMIT_CASE(max_vertex_attribs,					GL_MAX_VERTEX_ATTRIBS,					GLint,		8);
	LIMIT_CASE(max_vertex_uniform_vectors,			GL_MAX_VERTEX_UNIFORM_VECTORS,			GLint,		128);
	LIMIT_CASE(max_varying_vectors,					GL_MAX_VARYING_VECTORS,					GLint,		8);
	LIMIT_CASE(max_combined_texture_image_units,	GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,	GLint,		8);
	LIMIT_CASE(max_vertex_texture_image_units,		GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,		GLint,		0);
	LIMIT_CASE(max_texture_image_units,				GL_MAX_TEXTURE_IMAGE_UNITS,				GLint,		8);
	LIMIT_CASE(max_fragment_uniform_vectors,		GL_MAX_FRAGMENT_UNIFORM_VECTORS,		GLint,		16);
	LIMIT_CASE(max_renderbuffer_size,				GL_MAX_RENDERBUFFER_SIZE,				GLint,		1);
}